

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  char local_98 [8];
  char errmsg [81];
  int *status_local;
  char *comm_local;
  void *value_local;
  char *keyname_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x1000022e = status;
    if (datatype == 0x10) {
      ffpkys(fptr,keyname,(char *)value,comm,status);
    }
    else if (datatype == 0xb) {
      ffpkyj(fptr,keyname,(ulong)*value,comm,status);
    }
    else if (datatype == 0xc) {
      ffpkyj(fptr,keyname,(long)*value,comm,status);
    }
    else if (datatype == 0x14) {
      ffpkyj(fptr,keyname,(ulong)*value,comm,status);
    }
    else if (datatype == 0x15) {
      ffpkyj(fptr,keyname,(long)*value,comm,status);
    }
    else if (datatype == 0x1e) {
      ffpkyg(fptr,keyname,(double)*value,0,comm,status);
    }
    else if (datatype == 0x1f) {
      ffpkyj(fptr,keyname,(long)*value,comm,status);
    }
    else if (datatype == 0xe) {
      ffpkyl(fptr,keyname,*value,comm,status);
    }
    else if (datatype == 0x28) {
      ffpkyuj(fptr,keyname,*value,comm,status);
    }
    else if (datatype == 0x50) {
      ffpkyuj(fptr,keyname,*value,comm,status);
    }
    else if (datatype == 0x29) {
      ffpkyj(fptr,keyname,*value,comm,status);
    }
    else if (datatype == 0x51) {
      ffpkyj(fptr,keyname,*value,comm,status);
    }
    else if (datatype == 0x2a) {
      ffpkye(fptr,keyname,*value,-7,comm,status);
    }
    else if (datatype == 0x52) {
      ffpkyd(fptr,keyname,*value,-0xf,comm,status);
    }
    else if (datatype == 0x53) {
      ffpkyc(fptr,keyname,(float *)value,-7,comm,status);
    }
    else if (datatype == 0xa3) {
      ffpkym(fptr,keyname,(double *)value,-0xf,comm,status);
    }
    else {
      snprintf(local_98,0x51,"Bad keyword datatype code: %d (ffpky)",(ulong)(uint)datatype);
      ffpmsg(local_98);
      *stack0xffffffffffffffc0 = 0x19a;
    }
    fptr_local._4_4_ = *stack0xffffffffffffffc0;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,/* I - name of keyword to write */
           void *value,        /* I - keyword value            */
           const char *comm,   /* I - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes a keyword value with the datatype specified by the 2nd argument.
*/
{
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffpkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned char *) value, comm, status);
    }
    else if (datatype == TSBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(signed char *) value, comm, status);
    }
    else if (datatype == TUSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned short *) value, comm, status);
    }
    else if (datatype == TSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(short *) value, comm, status);
    }
    else if (datatype == TUINT)
    {
        ffpkyg(fptr, keyname, (double) *(unsigned int *) value, 0,
               comm, status);
    }
    else if (datatype == TINT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(int *) value, comm, status);
    }
    else if (datatype == TLOGICAL)
    {
        ffpkyl(fptr, keyname, *(int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(unsigned long *) value,
               comm, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(ULONGLONG *) value,
               comm, status);
    }
    else if (datatype == TLONG)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(long *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffpkyj(fptr, keyname, *(LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffpkye(fptr, keyname, *(float *) value, -7, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffpkyd(fptr, keyname, *(double *) value, -15, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffpkyc(fptr, keyname, (float *) value, -7, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffpkym(fptr, keyname, (double *) value, -15, comm, status);
    }
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,"Bad keyword datatype code: %d (ffpky)", datatype);
        ffpmsg(errmsg);
        *status = BAD_DATATYPE;
    }

    return(*status);
}